

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O0

int Gia_ObjUnrReadCopy0(Gia_ManUnr_t *p,Gia_Obj_t *pObj,int Id)

{
  int iVar1;
  int iVar2;
  int Lit;
  int Id_local;
  Gia_Obj_t *pObj_local;
  Gia_ManUnr_t *p_local;
  
  iVar1 = Gia_ObjFaninId0(pObj,Id);
  iVar2 = Vec_IntEntry(p->vDegDiff,Id << 1);
  iVar1 = Gia_ObjUnrRead(p,iVar1,iVar2);
  iVar2 = Gia_ObjFaninC0(pObj);
  iVar1 = Abc_LitNotCond(iVar1,iVar2);
  return iVar1;
}

Assistant:

static inline int Gia_ObjUnrReadCopy0( Gia_ManUnr_t * p, Gia_Obj_t * pObj, int Id )  
{
    int Lit = Gia_ObjUnrRead(p, Gia_ObjFaninId0(pObj, Id), Vec_IntEntry(p->vDegDiff, 2*Id));
    return Abc_LitNotCond( Lit, Gia_ObjFaninC0(pObj) );
}